

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AirPlatformAppearance.cpp
# Opt level: O2

KBOOL __thiscall
KDIS::DATA_TYPE::AirPlatformAppearance::operator!=
          (AirPlatformAppearance *this,AirPlatformAppearance *Value)

{
  return *this != *Value;
}

Assistant:

KBOOL AirPlatformAppearance::operator == ( const AirPlatformAppearance & Value ) const
{
	// Lets do a single comparison instead of checking every field. 
	// This struct is basically a KUINT32 so lets cast it to one and compare.

	KUINT32 a = *( KUINT32 * )this;
	KUINT32 b = *( KUINT32 * )&Value;

    if( a != b )return false;
    return true;
}